

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

int64_t __thiscall
hta::storage::file::Metric::find_index_on_or_after_binary
          (Metric *this,TimePoint t,int64_t left,int64_t right,int64_t sz)

{
  TimePoint TVar1;
  uint64_t index;
  
  while( true ) {
    index = left;
    if (right <= (long)index) {
      __assert_fail("left < right",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0xa4,
                    "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    TVar1 = get_raw_ts(this,index);
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <=
        (long)TVar1.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __assert_fail("get_raw_ts(left) < t",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0xa6,
                    "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    if ((right != sz) &&
       (TVar1 = get_raw_ts(this,right),
       (long)TVar1.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r <
       (long)t.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r)) {
      __assert_fail("right == sz || t <= get_raw_ts(right)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0xa7,
                    "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    if (right - index == 1) {
      return right;
    }
    left = (long)(right + index) / 2;
    if (sz <= left) break;
    TVar1 = get_raw_ts(this,left);
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <=
        (long)TVar1.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      right = left;
      left = index;
    }
  }
  __assert_fail("pivot < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                ,0xae,
                "int64_t hta::storage::file::Metric::find_index_on_or_after_binary(TimePoint, int64_t, int64_t, int64_t)"
               );
}

Assistant:

int64_t Metric::find_index_on_or_after_binary(TimePoint t, int64_t left, int64_t right, int64_t sz)
{
    // left < right means right != 0
    // assumes monotonicity ts(left) < ts(right)
    // invariant ts(left) < t <= ts(right)
    // right can be size() // out of range, but the pivot can never be
    assert(left < right);
    // TODO expensive, use extra debug macro
    assert(get_raw_ts(left) < t);
    assert(right == sz || t <= get_raw_ts(right));

    if (right - left == 1)
    {
        return right;
    }
    auto pivot = (left + right) / 2;
    assert(pivot < sz);

    TimePoint t_pivot = get_raw_ts(pivot);
    if (t > t_pivot)
    {
        return find_index_on_or_after_binary(t, pivot, right, sz);
    }
    else
    {
        return find_index_on_or_after_binary(t, left, pivot, sz);
    }
}